

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cc
# Opt level: O1

void twohash_test(void)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  time_t tVar4;
  uint64_t a;
  int iVar5;
  int iVar6;
  ulong uVar7;
  timeval __test_begin;
  uint local_128 [66];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  a = 100;
  do {
    uVar7 = 0x14d;
    do {
      uVar1 = hash_shuffle_2uint(a,uVar7);
      printf("(%d,%d) = %u\n",a & 0xffffffff,uVar7 & 0xffffffff,(ulong)uVar1);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x155);
    a = a + 1;
  } while (a != 0x6c);
  iVar5 = 0;
  memset(local_128,0,0x100);
  do {
    iVar6 = 1000;
    do {
      iVar2 = rand();
      iVar3 = rand();
      uVar1 = hash_shuffle_2uint((long)(iVar2 % 0x8000),(long)(iVar3 % 0x8000));
      local_128[uVar1 & 0x3f] = local_128[uVar1 & 0x3f] + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 1000);
  uVar7 = 0;
  do {
    printf("%d %d\n",uVar7 & 0xffffffff,(ulong)local_128[uVar7]);
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x40);
  fprintf(_stderr,"%s PASSED\n","two-integer hash test");
  return;
}

Assistant:

void twohash_test()
{
    TEST_INIT();

    randomize();

    int n = 64;
    int i,j;
    uint32_t h;
    int *array = alca(int, n);

    for (i=100;i<108;++i) {
        for (j=333;j<341;++j){
            printf("(%d,%d) = %u\n", i, j, hash_shuffle_2uint(i,j));
        }
    }
    for (i=0;i<n;++i) array[i] = 0;
    for (i=0;i<1000;++i) {
        for (j=0;j<1000;++j){
            h = hash_shuffle_2uint(random(32768), random(32768)) & (uint32_t)(n-1);
            array[h]++;
        }
    }
    for (i=0;i<n;++i) {
        DBG("%d %d\n",i,array[i]);
    }

    TEST_RESULT("two-integer hash test");
}